

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

void Sbd_ParSetDefault(Sbd_Par_t *pPars)

{
  pPars->nLutSize = 4;
  pPars->nLutNum = 3;
  pPars->nCutSize = 10;
  pPars->nCutNum = 0x80;
  pPars->nTfoLevels = 5;
  pPars->nTfoFanMax = 4;
  pPars->nWinSizeMax = 2000;
  pPars->nBTLimit = 0;
  pPars->nWords = 1;
  pPars->fMapping = 1;
  pPars->fMoreCuts = 0;
  pPars->fFindDivs = 0;
  pPars->fUsePath = 0;
  pPars->fArea = 0;
  pPars->fArea = 0;
  pPars->fCover = 0;
  pPars->fVerbose = 0;
  pPars->fVeryVerbose = 0;
  return;
}

Assistant:

void Sbd_ParSetDefault( Sbd_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Sbd_Par_t) );
    pPars->nLutSize     = 4;    // target LUT size
    pPars->nLutNum      = 3;    // target LUT count
    pPars->nCutSize     = (pPars->nLutSize - 1) * pPars->nLutNum + 1;  // target cut size
    pPars->nCutNum      = 128;  // target cut count
    pPars->nTfoLevels   = 5;    // the number of TFO levels (windowing)
    pPars->nTfoFanMax   = 4;    // the max number of fanouts (windowing)
    pPars->nWinSizeMax  = 2000; // maximum window size (windowing)
    pPars->nBTLimit     = 0;    // maximum number of SAT conflicts 
    pPars->nWords       = 1;    // simulation word count
    pPars->fMapping     = 1;    // generate mapping
    pPars->fMoreCuts    = 0;    // use several cuts
    pPars->fFindDivs    = 0;    // perform divisor search
    pPars->fUsePath     = 0;    // optimize only critical path
    pPars->fArea        = 0;    // area-oriented optimization
    pPars->fCover       = 0;    // use complete cover procedure
    pPars->fVerbose     = 0;    // verbose flag
    pPars->fVeryVerbose = 0;    // verbose flag
}